

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_complex_acos(sexp ctx,sexp z)

{
  sexp psVar1;
  undefined8 in_RDI;
  sexp unaff_retaddr;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp in_stack_00000050;
  sexp in_stack_00000058;
  sexp in_stack_00000060;
  sexp real;
  sexp psVar2;
  undefined1 local_28 [32];
  
  local_28._16_8_ = 0x43e;
  memset(local_28,0,0x10);
  psVar2 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffffc0,0,0x10);
  local_28._0_8_ = local_28 + 0x10;
  local_28._8_8_ = (((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)local_28;
  psVar1 = (sexp)&stack0xffffffffffffffd0;
  real = (sexp)(((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffc0;
  local_28._16_8_ = sexp_complex_asin(unaff_retaddr,(sexp)in_RDI);
  psVar2 = sexp_make_complex(psVar2,real,psVar1);
  acos(-1.0);
  psVar1 = sexp_make_flonum(real,(double)psVar1);
  (psVar2->value).type.name = psVar1;
  psVar1 = sexp_sub(in_stack_00000060,in_stack_00000058,in_stack_00000050);
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)local_28._8_8_;
  return psVar1;
}

Assistant:

sexp sexp_complex_acos (sexp ctx, sexp z) {
  sexp_gc_var2(res, tmp);
  sexp_gc_preserve2(ctx, res, tmp);
  res = sexp_complex_asin(ctx, z);
  tmp = sexp_make_complex(ctx, SEXP_ZERO, SEXP_ZERO);
  sexp_complex_real(tmp) = sexp_make_flonum(ctx, acos(-1)/2);
  res = sexp_sub(ctx, tmp, res);
  sexp_gc_release2(ctx);
  return res;
}